

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.cpp
# Opt level: O0

void test_qclab_dense_SquareMatrix<std::complex<float>>(void)

{
  bool bVar1;
  char *pcVar2;
  complex<float> *pcVar3;
  complex<float> cVar4;
  complex<float> cVar5;
  complex<float> value;
  complex<float> m01;
  complex<float> m01_00;
  complex<float> m01_01;
  complex<float> m01_02;
  complex<float> m01_03;
  complex<float> m01_04;
  complex<float> m01_05;
  complex<float> m01_06;
  complex<float> m01_07;
  complex<float> m01_08;
  complex<float> m01_09;
  complex<float> m01_10;
  complex<float> m01_11;
  complex<float> m01_12;
  complex<float> m01_13;
  complex<float> m01_14;
  complex<float> m01_15;
  complex<float> m01_16;
  complex<float> cVar6;
  complex<float> in_R9;
  undefined2 in_stack_ffffffffffffe038;
  undefined1 in_stack_ffffffffffffe03a;
  undefined1 in_stack_ffffffffffffe03b;
  undefined1 in_stack_ffffffffffffe03c;
  undefined1 in_stack_ffffffffffffe03d;
  undefined1 in_stack_ffffffffffffe03e;
  undefined1 in_stack_ffffffffffffe03f;
  complex<float> in_stack_ffffffffffffe040;
  complex<float> in_stack_ffffffffffffe048;
  string local_1b70;
  AssertHelper local_1b50;
  Message local_1b48;
  bool local_1b39;
  undefined1 local_1b38 [8];
  AssertionResult gtest_ar__36;
  complex<float> local_1b20;
  complex<float> local_1b18;
  complex<float> local_1b10;
  undefined1 local_1b08 [8];
  SquareMatrix<std::complex<float>_> I_check;
  SquareMatrix<std::complex<float>_> I;
  AssertHelper local_1ac8;
  Message local_1ac0;
  bool local_1ab1;
  undefined1 local_1ab0 [8];
  AssertionResult gtest_ar__35;
  complex<float> local_1a98;
  complex<float> local_1a90;
  complex<float> local_1a88;
  undefined1 local_1a80 [8];
  SquareMatrix<std::complex<float>_> Z_check;
  SquareMatrix<std::complex<float>_> Z;
  AssertHelper local_1a40;
  Message local_1a38;
  bool local_1a29;
  undefined1 local_1a28 [8];
  AssertionResult gtest_ar__34;
  AssertHelper local_19f8;
  Message local_19f0;
  bool local_19e1;
  undefined1 local_19e0 [8];
  AssertionResult gtest_ar__33;
  AssertHelper local_19b0;
  Message local_19a8;
  bool local_1999;
  undefined1 local_1998 [8];
  AssertionResult gtest_ar__32;
  SquareMatrix<std::complex<float>_> prod;
  AssertHelper local_1958;
  Message local_1950;
  bool local_1941;
  undefined1 local_1940 [8];
  AssertionResult gtest_ar__31;
  Message local_1928;
  int local_191c;
  int64_t local_1918;
  undefined1 local_1910 [8];
  AssertionResult gtest_ar_58;
  SquareMatrix<std::complex<float>_> local_18f0;
  SquareMatrix<std::complex<float>_> local_18e0;
  undefined1 local_18d0 [8];
  SquareMatrix<std::complex<float>_> prodABCD;
  AssertHelper local_18a0;
  Message local_1898;
  bool local_1889;
  undefined1 local_1888 [8];
  AssertionResult gtest_ar__30;
  Message local_1870;
  int local_1864;
  int64_t local_1860;
  undefined1 local_1858 [8];
  AssertionResult gtest_ar_57;
  SquareMatrix<std::complex<float>_> local_1838;
  undefined1 local_1828 [8];
  SquareMatrix<std::complex<float>_> prodABC;
  AssertHelper local_17f8;
  Message local_17f0;
  bool local_17e1;
  undefined1 local_17e0 [8];
  AssertionResult gtest_ar__29;
  Message local_17c8;
  int local_17bc;
  int64_t local_17b8;
  undefined1 local_17b0 [8];
  AssertionResult gtest_ar_56;
  undefined1 local_1790 [8];
  SquareMatrix<std::complex<float>_> prodAB;
  complex<float> local_1778;
  complex<float> local_1770;
  complex<float> local_1768;
  undefined1 local_1760 [8];
  SquareMatrix<std::complex<float>_> prodABCD_check;
  complex<float> local_1748;
  complex<float> local_1740;
  complex<float> local_1738;
  undefined1 local_1730 [8];
  SquareMatrix<std::complex<float>_> prodABC_check;
  complex<float> local_1718;
  complex<float> local_1710;
  complex<float> local_1708;
  undefined1 local_1700 [8];
  SquareMatrix<std::complex<float>_> prodAB_check;
  AssertHelper local_16d0;
  Message local_16c8;
  undefined1 local_16b9 [9];
  AssertionResult gtest_ar__28;
  AssertHelper local_1688;
  Message local_1680;
  bool local_1671;
  undefined1 local_1670 [8];
  AssertionResult gtest_ar__27;
  AssertHelper local_1640;
  Message local_1638;
  bool local_1629;
  undefined1 local_1628 [8];
  AssertionResult gtest_ar__26;
  SquareMatrix<std::complex<float>_> minus;
  AssertHelper local_15e8;
  Message local_15e0;
  bool local_15d1;
  undefined1 local_15d0 [8];
  AssertionResult gtest_ar__25;
  Message local_15b8;
  int local_15ac;
  int64_t local_15a8;
  undefined1 local_15a0 [8];
  AssertionResult gtest_ar_55;
  SquareMatrix<std::complex<float>_> local_1580;
  SquareMatrix<std::complex<float>_> local_1570;
  undefined1 local_1560 [8];
  SquareMatrix<std::complex<float>_> minusABCD;
  AssertHelper local_1530;
  Message local_1528;
  bool local_1519;
  undefined1 local_1518 [8];
  AssertionResult gtest_ar__24;
  Message local_1500;
  int local_14f4;
  int64_t local_14f0;
  undefined1 local_14e8 [8];
  AssertionResult gtest_ar_54;
  SquareMatrix<std::complex<float>_> local_14c8;
  undefined1 local_14b8 [8];
  SquareMatrix<std::complex<float>_> minusABC;
  AssertHelper local_1488;
  Message local_1480;
  bool local_1471;
  undefined1 local_1470 [8];
  AssertionResult gtest_ar__23;
  Message local_1458;
  int local_144c;
  int64_t local_1448;
  undefined1 local_1440 [8];
  AssertionResult gtest_ar_53;
  undefined1 local_1420 [8];
  SquareMatrix<std::complex<float>_> minusAB;
  complex<float> local_1408;
  complex<float> local_1400;
  complex<float> local_13f8;
  undefined1 local_13f0 [8];
  SquareMatrix<std::complex<float>_> minusABCD_check;
  complex<float> local_13d8;
  complex<float> local_13d0;
  complex<float> local_13c8;
  undefined1 local_13c0 [8];
  SquareMatrix<std::complex<float>_> minusABC_check;
  complex<float> local_13a8;
  complex<float> local_13a0;
  complex<float> local_1398;
  undefined1 local_1390 [8];
  SquareMatrix<std::complex<float>_> minusAB_check;
  AssertHelper local_1360;
  Message local_1358;
  undefined1 local_1349 [9];
  AssertionResult gtest_ar__22;
  AssertHelper local_1318;
  Message local_1310;
  bool local_1301;
  undefined1 local_1300 [8];
  AssertionResult gtest_ar__21;
  AssertHelper local_12d0;
  Message local_12c8;
  bool local_12b9;
  undefined1 local_12b8 [8];
  AssertionResult gtest_ar__20;
  SquareMatrix<std::complex<float>_> sum;
  AssertHelper local_1278;
  Message local_1270;
  bool local_1261;
  undefined1 local_1260 [8];
  AssertionResult gtest_ar__19;
  Message local_1248;
  int local_123c;
  int64_t local_1238;
  undefined1 local_1230 [8];
  AssertionResult gtest_ar_52;
  SquareMatrix<std::complex<float>_> local_1210;
  SquareMatrix<std::complex<float>_> local_1200;
  undefined1 local_11f0 [8];
  SquareMatrix<std::complex<float>_> sumABCD;
  AssertHelper local_11c0;
  Message local_11b8;
  bool local_11a9;
  undefined1 local_11a8 [8];
  AssertionResult gtest_ar__18;
  Message local_1190;
  int local_1184;
  int64_t local_1180;
  undefined1 local_1178 [8];
  AssertionResult gtest_ar_51;
  SquareMatrix<std::complex<float>_> local_1158;
  undefined1 local_1148 [8];
  SquareMatrix<std::complex<float>_> sumABC;
  AssertHelper local_1118;
  Message local_1110;
  bool local_1101;
  undefined1 local_1100 [8];
  AssertionResult gtest_ar__17;
  Message local_10e8;
  int local_10dc;
  int64_t local_10d8;
  undefined1 local_10d0 [8];
  AssertionResult gtest_ar_50;
  undefined1 local_10b0 [8];
  SquareMatrix<std::complex<float>_> sumAB;
  complex<float> local_1098;
  complex<float> local_1090;
  complex<float> local_1088;
  undefined1 local_1080 [8];
  SquareMatrix<std::complex<float>_> sumABCD_check;
  complex<float> local_1068;
  complex<float> local_1060;
  complex<float> local_1058;
  undefined1 local_1050 [8];
  SquareMatrix<std::complex<float>_> sumABC_check;
  complex<float> local_1038;
  complex<float> local_1030;
  complex<float> local_1028;
  undefined1 local_1020 [8];
  SquareMatrix<std::complex<float>_> sumAB_check;
  complex<float> local_1008;
  complex<float> local_1000;
  complex<float> local_ff8;
  undefined1 local_ff0 [8];
  SquareMatrix<std::complex<float>_> D;
  complex<float> local_fd8;
  complex<float> local_fd0;
  complex<float> local_fc8;
  undefined1 local_fc0 [8];
  SquareMatrix<std::complex<float>_> C;
  complex<float> local_fa8;
  complex<float> local_fa0;
  complex<float> local_f98;
  undefined1 local_f90 [8];
  SquareMatrix<std::complex<float>_> B;
  complex<float> local_f78;
  complex<float> local_f70;
  complex<float> local_f68;
  undefined1 local_f60 [8];
  SquareMatrix<std::complex<float>_> A;
  AssertHelper local_f30;
  Message local_f28;
  undefined1 local_f19 [9];
  AssertionResult gtest_ar__16;
  AssertHelper local_ee8;
  Message local_ee0;
  bool local_ed1;
  undefined1 local_ed0 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_ea0;
  Message local_e98;
  bool local_e89;
  undefined1 local_e88 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_e58;
  Message local_e50;
  bool local_e41;
  undefined1 local_e40 [8];
  AssertionResult gtest_ar__13;
  complex<float> local_e28;
  complex<float> local_e20;
  complex<float> local_e18;
  complex<float> local_e10;
  complex<float> local_e08;
  complex<float> local_e00;
  complex<float> local_df8;
  complex<float> local_df0;
  complex<float> local_de8;
  complex<float> local_de0;
  complex<float> local_dd8;
  complex<float> local_dd0;
  complex<float> local_dc8;
  complex<float> local_dc0;
  complex<float> local_db8;
  undefined1 local_db0 [8];
  SquareMatrix<std::complex<float>_> M5;
  AssertHelper local_d80;
  Message local_d78;
  undefined1 local_d69 [9];
  AssertionResult gtest_ar__12;
  AssertHelper local_d38;
  Message local_d30;
  bool local_d21;
  undefined1 local_d20 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_cf0;
  Message local_ce8;
  bool local_cd9;
  undefined1 local_cd8 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_ca8;
  Message local_ca0;
  bool local_c91;
  undefined1 local_c90 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_c60;
  Message local_c58;
  bool local_c49;
  undefined1 local_c48 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_c18;
  Message local_c10;
  bool local_c01;
  undefined1 local_c00 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_bd0;
  Message local_bc8;
  bool local_bb9;
  undefined1 local_bb8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_b88;
  Message local_b80;
  bool local_b71;
  undefined1 local_b70 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_b40;
  Message local_b38;
  bool local_b29;
  undefined1 local_b28 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_af8;
  Message local_af0;
  bool local_ae1;
  undefined1 local_ae0 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_ab0;
  Message local_aa8;
  bool local_a99;
  undefined1 local_a98 [8];
  AssertionResult gtest_ar__2;
  Message local_a80;
  int local_a74;
  int64_t local_a70;
  undefined1 local_a68 [8];
  AssertionResult gtest_ar_49;
  Message local_a50;
  int local_a44;
  int64_t local_a40;
  undefined1 local_a38 [8];
  AssertionResult gtest_ar_48;
  Message local_a20;
  int local_a14;
  int64_t local_a10;
  undefined1 local_a08 [8];
  AssertionResult gtest_ar_47;
  Message local_9f0;
  int local_9e4;
  int64_t local_9e0;
  undefined1 local_9d8 [8];
  AssertionResult gtest_ar_46;
  SquareMatrix<std::complex<float>_> M2copy;
  AssertHelper local_998;
  Message local_990;
  bool local_981;
  undefined1 local_980 [8];
  AssertionResult gtest_ar__1;
  Message local_968;
  int local_95c;
  int64_t local_958;
  undefined1 local_950 [8];
  AssertionResult gtest_ar_45;
  Message local_938;
  int local_92c;
  int64_t local_928;
  undefined1 local_920 [8];
  AssertionResult gtest_ar_44;
  Message local_908;
  int local_8fc;
  int64_t local_8f8;
  undefined1 local_8f0 [8];
  AssertionResult gtest_ar_43;
  Message local_8d8;
  int local_8cc;
  int64_t local_8c8;
  undefined1 local_8c0 [8];
  AssertionResult gtest_ar_42;
  SquareMatrix<std::complex<float>_> M1copy;
  AssertHelper local_880;
  Message local_878;
  bool local_869;
  undefined1 local_868 [8];
  AssertionResult gtest_ar_;
  Message local_850;
  int local_844;
  int64_t local_840;
  undefined1 local_838 [8];
  AssertionResult gtest_ar_41;
  Message local_820;
  int local_814;
  int64_t local_810;
  undefined1 local_808 [8];
  AssertionResult gtest_ar_40;
  Message local_7f0;
  int local_7e4;
  int64_t local_7e0;
  undefined1 local_7d8 [8];
  AssertionResult gtest_ar_39;
  Message local_7c0;
  int local_7b4;
  int64_t local_7b0;
  undefined1 local_7a8 [8];
  AssertionResult gtest_ar_38;
  SquareMatrix<std::complex<float>_> M4copy;
  Message local_780;
  complex<float> local_778;
  undefined1 local_770 [8];
  AssertionResult gtest_ar_37;
  Message local_758;
  complex<float> local_750;
  undefined1 local_748 [8];
  AssertionResult gtest_ar_36;
  Message local_730;
  complex<float> local_728;
  undefined1 local_720 [8];
  AssertionResult gtest_ar_35;
  Message local_708;
  complex<float> local_700;
  undefined1 local_6f8 [8];
  AssertionResult gtest_ar_34;
  Message local_6e0;
  complex<float> local_6d8;
  undefined1 local_6d0 [8];
  AssertionResult gtest_ar_33;
  Message local_6b8;
  complex<float> local_6b0;
  undefined1 local_6a8 [8];
  AssertionResult gtest_ar_32;
  Message local_690;
  complex<float> local_688;
  undefined1 local_680 [8];
  AssertionResult gtest_ar_31;
  Message local_668;
  complex<float> local_660;
  undefined1 local_658 [8];
  AssertionResult gtest_ar_30;
  Message local_640;
  complex<float> local_638;
  undefined1 local_630 [8];
  AssertionResult gtest_ar_29;
  Message local_618;
  complex<float> local_610;
  undefined1 local_608 [8];
  AssertionResult gtest_ar_28;
  Message local_5f0;
  complex<float> local_5e8;
  undefined1 local_5e0 [8];
  AssertionResult gtest_ar_27;
  Message local_5c8;
  complex<float> local_5c0;
  undefined1 local_5b8 [8];
  AssertionResult gtest_ar_26;
  Message local_5a0;
  complex<float> local_598;
  undefined1 local_590 [8];
  AssertionResult gtest_ar_25;
  Message local_578;
  complex<float> local_570;
  undefined1 local_568 [8];
  AssertionResult gtest_ar_24;
  Message local_550;
  complex<float> local_548;
  undefined1 local_540 [8];
  AssertionResult gtest_ar_23;
  Message local_528;
  complex<float> local_520;
  undefined1 local_518 [8];
  AssertionResult gtest_ar_22;
  Message local_500;
  int local_4f4;
  int64_t local_4f0;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar_21;
  Message local_4d0;
  int local_4c4;
  int64_t local_4c0;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar_20;
  Message local_4a0;
  int local_494;
  int64_t local_490;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_19;
  Message local_470;
  int local_464;
  int64_t local_460;
  undefined1 local_458 [8];
  AssertionResult gtest_ar_18;
  complex<float> local_440;
  complex<float> local_438;
  complex<float> local_430;
  complex<float> local_428;
  complex<float> local_420;
  complex<float> local_418;
  complex<float> local_410;
  complex<float> local_408;
  complex<float> local_400;
  complex<float> local_3f8;
  complex<float> local_3f0;
  complex<float> local_3e8;
  complex<float> local_3e0;
  complex<float> local_3d8;
  complex<float> local_3d0;
  undefined1 local_3c8 [8];
  SquareMatrix<std::complex<float>_> M4;
  Message local_3b0;
  complex<float> local_3a8;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar_17;
  Message local_388;
  complex<float> local_380;
  undefined1 local_378 [8];
  AssertionResult gtest_ar_16;
  Message local_360;
  complex<float> local_358;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_15;
  Message local_338;
  complex<float> local_330;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_14;
  Message local_310;
  int local_304;
  int64_t local_300;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_13;
  Message local_2e0;
  int local_2d4;
  int64_t local_2d0;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_12;
  Message local_2b0;
  int local_2a4;
  int64_t local_2a0;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_11;
  Message local_280;
  int local_274;
  int64_t local_270;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_10;
  complex<float> local_250;
  complex<float> local_248;
  complex<float> local_240;
  undefined1 local_238 [8];
  SquareMatrix<std::complex<float>_> M3;
  Message local_220;
  complex<float> local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_9;
  int j_2;
  int i_2;
  Message local_1f0;
  undefined1 local_1e4 [4];
  complex<float> local_1e0;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_8;
  Message local_1c0;
  int local_1b4;
  int64_t local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_7;
  Message local_190;
  int local_184;
  int64_t local_180;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_6;
  Message local_160;
  int local_154;
  int64_t local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_5;
  undefined1 local_130 [8];
  SquareMatrix<std::complex<float>_> M2;
  Message local_118;
  complex<float> local_110;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_4;
  int local_f0;
  int j_1;
  int i_1;
  int j;
  int i;
  int c;
  Message local_d8;
  int local_cc;
  int64_t local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_3;
  Message local_a8;
  int local_9c;
  int64_t local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_2;
  Message local_78;
  int local_6c;
  int64_t local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  Message local_48;
  int local_40 [4];
  int64_t local_30;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  SquareMatrix<std::complex<float>_> M1;
  
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar.message_,3);
  local_30 = qclab::dense::SquareMatrix<std::complex<float>_>::size
                       ((SquareMatrix<std::complex<float>_> *)&gtest_ar.message_);
  local_40[0] = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_28,"M1.size()","3",&local_30,local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(&local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  local_68 = qclab::dense::SquareMatrix<std::complex<float>_>::rows
                       ((SquareMatrix<std::complex<float>_> *)&gtest_ar.message_);
  local_6c = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_60,"M1.rows()","3",&local_68,&local_6c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,10,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  local_98 = qclab::dense::SquareMatrix<std::complex<float>_>::cols
                       ((SquareMatrix<std::complex<float>_> *)&gtest_ar.message_);
  local_9c = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_90,"M1.cols()","3",&local_98,&local_9c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_c8 = qclab::dense::SquareMatrix<std::complex<float>_>::ld
                       ((SquareMatrix<std::complex<float>_> *)&gtest_ar.message_);
  local_cc = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_c0,"M1.ld()","3",&local_c8,&local_cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&i,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&i,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  j = 0;
  for (i_1 = 0; i_1 < 3; i_1 = i_1 + 1) {
    for (j_1 = 0; j_1 < 3; j_1 = j_1 + 1) {
      pcVar3 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                         ((SquareMatrix<std::complex<float>_> *)&gtest_ar.message_,(long)i_1,
                          (long)j_1);
      std::complex<float>::operator=(pcVar3,(float)j + 0.5);
      j = j + 1;
    }
  }
  j = 0;
  for (local_f0 = 0; local_f0 < 3; local_f0 = local_f0 + 1) {
    for (gtest_ar_4.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl._4_4_ = 0;
        gtest_ar_4.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ < 3;
        gtest_ar_4.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ =
             gtest_ar_4.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl._4_4_ + 1) {
      pcVar3 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                         ((SquareMatrix<std::complex<float>_> *)&gtest_ar.message_,(long)local_f0,
                          (long)gtest_ar_4.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_);
      std::complex<float>::complex(&local_110,(float)j + 0.5,0.0);
      testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
                ((EqHelper *)local_108,"M1(i,j)","T(c + 0.5)",pcVar3,&local_110);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
      if (!bVar1) {
        testing::Message::Message(&local_118);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&M2.data_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
                   ,0x18,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&M2.data_,&local_118);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M2.data_);
        testing::Message::~Message(&local_118);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
      j = j + 1;
    }
  }
  std::complex<float>::complex((complex<float> *)&gtest_ar_5.message_,3.14,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_130,3,value);
  local_150 = qclab::dense::SquareMatrix<std::complex<float>_>::size
                        ((SquareMatrix<std::complex<float>_> *)local_130);
  local_154 = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_148,"M2.size()","3",&local_150,&local_154);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x1e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  local_180 = qclab::dense::SquareMatrix<std::complex<float>_>::rows
                        ((SquareMatrix<std::complex<float>_> *)local_130);
  local_184 = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_178,"M2.rows()","3",&local_180,&local_184);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x1f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  local_1b0 = qclab::dense::SquareMatrix<std::complex<float>_>::cols
                        ((SquareMatrix<std::complex<float>_> *)local_130);
  local_1b4 = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_1a8,"M2.cols()","3",&local_1b0,&local_1b4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_1c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x20,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  local_1e0._M_value =
       qclab::dense::SquareMatrix<std::complex<float>_>::ld
                 ((SquareMatrix<std::complex<float>_> *)local_130);
  local_1e4 = (undefined1  [4])0x3;
  pcVar2 = "M2.ld()";
  cVar5._M_value = (_ComplexT)&local_1e0;
  cVar4._M_value = (_ComplexT)local_1e4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_1d8,"M2.ld()","3",(long *)cVar5._M_value,(int *)cVar4._M_value);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    cVar4._M_value =
         (_ComplexT)testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    cVar5._M_value = 0x21;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&j_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x21,(char *)cVar4._M_value);
    pcVar2 = (char *)&local_1f0;
    testing::internal::AssertHelper::operator=((AssertHelper *)&j_2,(Message *)pcVar2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&j_2);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  for (gtest_ar_9.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl._4_4_ = 0;
      gtest_ar_9.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ < 3;
      gtest_ar_9.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ =
           gtest_ar_9.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl._4_4_ + 1) {
    for (gtest_ar_9.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl._0_4_ = 0;
        (int)gtest_ar_9.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl < 3;
        gtest_ar_9.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ =
             (int)gtest_ar_9.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl + 1) {
      cVar5._M_value =
           (_ComplexT)
           qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)local_130,
                      (long)gtest_ar_9.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_,
                      (long)(int)gtest_ar_9.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl);
      std::complex<float>::complex(&local_218,3.14,0.0);
      pcVar2 = "M2(i,j)";
      cVar4._M_value = (_ComplexT)&local_218;
      testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
                ((EqHelper *)local_210,"M2(i,j)","T(3.14)",(complex<float> *)cVar5._M_value,
                 (complex<float> *)cVar4._M_value);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
      if (!bVar1) {
        testing::Message::Message(&local_220);
        cVar4._M_value =
             (_ComplexT)testing::AssertionResult::failure_message((AssertionResult *)local_210);
        cVar5._M_value = 0x25;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&M3.data_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
                   ,0x25,(char *)cVar4._M_value);
        pcVar2 = (char *)&local_220;
        testing::internal::AssertHelper::operator=((AssertHelper *)&M3.data_,(Message *)pcVar2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M3.data_);
        testing::Message::~Message(&local_220);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
    }
  }
  std::complex<float>::complex(&local_240,1.0,0.0);
  std::complex<float>::complex(&local_248,2.0,0.0);
  std::complex<float>::complex(&local_250,3.0,0.0);
  std::complex<float>::complex((complex<float> *)&gtest_ar_10.message_,4.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_238,(complex<float>)pcVar2,m01,cVar5,cVar4)
  ;
  local_270 = qclab::dense::SquareMatrix<std::complex<float>_>::size
                        ((SquareMatrix<std::complex<float>_> *)local_238);
  local_274 = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_268,"M3.size()","2",&local_270,&local_274);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_280);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  local_2a0 = qclab::dense::SquareMatrix<std::complex<float>_>::rows
                        ((SquareMatrix<std::complex<float>_> *)local_238);
  local_2a4 = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_298,"M3.rows()","2",&local_2a0,&local_2a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  local_2d0 = qclab::dense::SquareMatrix<std::complex<float>_>::cols
                        ((SquareMatrix<std::complex<float>_> *)local_238);
  local_2d4 = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_2c8,"M3.cols()","2",&local_2d0,&local_2d4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar1) {
    testing::Message::Message(&local_2e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x2d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  local_300 = qclab::dense::SquareMatrix<std::complex<float>_>::ld
                        ((SquareMatrix<std::complex<float>_> *)local_238);
  local_304 = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_2f8,"M3.ld()","2",&local_300,&local_304);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar1) {
    testing::Message::Message(&local_310);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x2e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  pcVar3 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)local_238,0,0);
  std::complex<float>::complex(&local_330,1.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_328,"M3(0,0)","T(1.0)",pcVar3,&local_330);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
  if (!bVar1) {
    testing::Message::Message(&local_338);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x30,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
  pcVar3 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)local_238,1,0);
  std::complex<float>::complex(&local_358,3.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_350,"M3(1,0)","T(3.0)",pcVar3,&local_358);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar1) {
    testing::Message::Message(&local_360);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x31,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_360);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  pcVar3 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)local_238,0,1);
  std::complex<float>::complex(&local_380,2.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_378,"M3(0,1)","T(2.0)",pcVar3,&local_380);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar1) {
    testing::Message::Message(&local_388);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x32,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  pcVar3 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)local_238,1,1);
  std::complex<float>::complex(&local_3a8,4.0,0.0);
  pcVar2 = "M3(1,1)";
  cVar5._M_value = (_ComplexT)&local_3a8;
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_3a0,"M3(1,1)","T(4.0)",pcVar3,(complex<float> *)cVar5._M_value);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
  if (!bVar1) {
    testing::Message::Message(&local_3b0);
    cVar5._M_value =
         (_ComplexT)testing::AssertionResult::failure_message((AssertionResult *)local_3a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M4.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x33,(char *)cVar5._M_value);
    pcVar2 = (char *)&local_3b0;
    testing::internal::AssertHelper::operator=((AssertHelper *)&M4.data_,(Message *)pcVar2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M4.data_);
    testing::Message::~Message(&local_3b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
  std::complex<float>::complex(&local_3d0,1.0,0.0);
  std::complex<float>::complex(&local_3d8,2.0,0.0);
  std::complex<float>::complex(&local_3e0,3.0,0.0);
  std::complex<float>::complex(&local_3e8,4.0,0.0);
  std::complex<float>::complex(&local_3f0,5.0,0.0);
  std::complex<float>::complex(&local_3f8,6.0,0.0);
  std::complex<float>::complex(&local_400,7.0,0.0);
  std::complex<float>::complex(&local_408,8.0,0.0);
  std::complex<float>::complex(&local_410,9.0,0.0);
  std::complex<float>::complex(&local_418,10.0,0.0);
  std::complex<float>::complex(&local_420,11.0,0.0);
  std::complex<float>::complex(&local_428,12.0,0.0);
  std::complex<float>::complex(&local_430,13.0,0.0);
  std::complex<float>::complex(&local_438,14.0,0.0);
  std::complex<float>::complex(&local_440,15.0,0.0);
  std::complex<float>::complex((complex<float> *)&gtest_ar_18.message_,16.0,0.0);
  cVar4._M_value._2_1_ = in_stack_ffffffffffffe03a;
  cVar4._M_value._0_2_ = in_stack_ffffffffffffe038;
  cVar4._M_value._3_1_ = in_stack_ffffffffffffe03b;
  cVar4._M_value._4_1_ = in_stack_ffffffffffffe03c;
  cVar4._M_value._5_1_ = in_stack_ffffffffffffe03d;
  cVar4._M_value._6_1_ = in_stack_ffffffffffffe03e;
  cVar4._M_value._7_1_ = in_stack_ffffffffffffe03f;
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_3c8,(complex<float>)pcVar2,m01_00,local_410
             ,cVar5,in_R9,local_410,local_418,local_420,local_428,local_430,local_438,local_440,
             (complex<float>)
             gtest_ar_18.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,cVar4,in_stack_ffffffffffffe040,in_stack_ffffffffffffe048);
  local_460 = qclab::dense::SquareMatrix<std::complex<float>_>::size
                        ((SquareMatrix<std::complex<float>_> *)local_3c8);
  local_464 = 4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_458,"M4.size()","4",&local_460,&local_464);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
  if (!bVar1) {
    testing::Message::Message(&local_470);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_458);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x39,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_470);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
  local_490 = qclab::dense::SquareMatrix<std::complex<float>_>::rows
                        ((SquareMatrix<std::complex<float>_> *)local_3c8);
  local_494 = 4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_488,"M4.rows()","4",&local_490,&local_494);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
  if (!bVar1) {
    testing::Message::Message(&local_4a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_488);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x3a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_4a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
  local_4c0 = qclab::dense::SquareMatrix<std::complex<float>_>::cols
                        ((SquareMatrix<std::complex<float>_> *)local_3c8);
  local_4c4 = 4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_4b8,"M4.cols()","4",&local_4c0,&local_4c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
  if (!bVar1) {
    testing::Message::Message(&local_4d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x3b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_4d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_4d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
  local_4f0 = qclab::dense::SquareMatrix<std::complex<float>_>::ld
                        ((SquareMatrix<std::complex<float>_> *)local_3c8);
  local_4f4 = 4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_4e8,"M4.ld()","4",&local_4f0,&local_4f4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
  if (!bVar1) {
    testing::Message::Message(&local_500);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x3c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_500);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_500);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
  pcVar3 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)local_3c8,0,0);
  std::complex<float>::complex(&local_520,1.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_518,"M4(0,0)","T( 1.0)",pcVar3,&local_520);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_518);
  if (!bVar1) {
    testing::Message::Message(&local_528);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_518);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_528);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_528);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_518);
  pcVar3 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)local_3c8,1,0);
  std::complex<float>::complex(&local_548,5.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_540,"M4(1,0)","T( 5.0)",pcVar3,&local_548);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_540);
  if (!bVar1) {
    testing::Message::Message(&local_550);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_540);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x40,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_550);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_550);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_540);
  pcVar3 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)local_3c8,2,0);
  std::complex<float>::complex(&local_570,9.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_568,"M4(2,0)","T( 9.0)",pcVar3,&local_570);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_568);
  if (!bVar1) {
    testing::Message::Message(&local_578);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_568);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_578);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_578);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_568);
  pcVar3 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)local_3c8,3,0);
  std::complex<float>::complex(&local_598,13.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_590,"M4(3,0)","T(13.0)",pcVar3,&local_598);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_590);
  if (!bVar1) {
    testing::Message::Message(&local_5a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_590);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_5a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_5a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_590);
  pcVar3 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)local_3c8,0,1);
  std::complex<float>::complex(&local_5c0,2.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_5b8,"M4(0,1)","T( 2.0)",pcVar3,&local_5c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b8);
  if (!bVar1) {
    testing::Message::Message(&local_5c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_5c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_5c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b8);
  pcVar3 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)local_3c8,1,1);
  std::complex<float>::complex(&local_5e8,6.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_5e0,"M4(1,1)","T( 6.0)",pcVar3,&local_5e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e0);
  if (!bVar1) {
    testing::Message::Message(&local_5f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,&local_5f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(&local_5f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e0);
  pcVar3 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)local_3c8,2,1);
  std::complex<float>::complex(&local_610,10.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_608,"M4(2,1)","T(10.0)",pcVar3,&local_610);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_608);
  if (!bVar1) {
    testing::Message::Message(&local_618);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_608);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_618);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_618);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_608);
  pcVar3 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)local_3c8,3,1);
  std::complex<float>::complex(&local_638,14.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_630,"M4(3,1)","T(14.0)",pcVar3,&local_638);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_630);
  if (!bVar1) {
    testing::Message::Message(&local_640);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_630);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_30.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x47,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_30.message_,&local_640);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30.message_);
    testing::Message::~Message(&local_640);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_630);
  pcVar3 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)local_3c8,0,2);
  std::complex<float>::complex(&local_660,3.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_658,"M4(0,2)","T( 3.0)",pcVar3,&local_660);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_658);
  if (!bVar1) {
    testing::Message::Message(&local_668);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_658);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,&local_668);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
    testing::Message::~Message(&local_668);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_658);
  pcVar3 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)local_3c8,1,2);
  std::complex<float>::complex(&local_688,7.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_680,"M4(1,2)","T( 7.0)",pcVar3,&local_688);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_680);
  if (!bVar1) {
    testing::Message::Message(&local_690);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_680);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_32.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_32.message_,&local_690);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_32.message_);
    testing::Message::~Message(&local_690);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_680);
  pcVar3 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)local_3c8,2,2);
  std::complex<float>::complex(&local_6b0,11.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_6a8,"M4(2,2)","T(11.0)",pcVar3,&local_6b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a8);
  if (!bVar1) {
    testing::Message::Message(&local_6b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_33.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_33.message_,&local_6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_33.message_);
    testing::Message::~Message(&local_6b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a8);
  pcVar3 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)local_3c8,3,2);
  std::complex<float>::complex(&local_6d8,15.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_6d0,"M4(3,2)","T(15.0)",pcVar3,&local_6d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d0);
  if (!bVar1) {
    testing::Message::Message(&local_6e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x4c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34.message_,&local_6e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34.message_);
    testing::Message::~Message(&local_6e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d0);
  pcVar3 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)local_3c8,0,3);
  std::complex<float>::complex(&local_700,4.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_6f8,"M4(0,3)","T( 4.0)",pcVar3,&local_700);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f8);
  if (!bVar1) {
    testing::Message::Message(&local_708);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_35.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x4e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_35.message_,&local_708);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_35.message_);
    testing::Message::~Message(&local_708);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f8);
  pcVar3 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)local_3c8,1,3);
  std::complex<float>::complex(&local_728,8.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_720,"M4(1,3)","T( 8.0)",pcVar3,&local_728);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_720);
  if (!bVar1) {
    testing::Message::Message(&local_730);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_720);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_36.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x4f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_36.message_,&local_730);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_36.message_);
    testing::Message::~Message(&local_730);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_720);
  pcVar3 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)local_3c8,2,3);
  std::complex<float>::complex(&local_750,12.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_748,"M4(2,3)","T(12.0)",pcVar3,&local_750);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_748);
  if (!bVar1) {
    testing::Message::Message(&local_758);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_748);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_37.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x50,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_37.message_,&local_758);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_37.message_);
    testing::Message::~Message(&local_758);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_748);
  pcVar3 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)local_3c8,3,3);
  std::complex<float>::complex(&local_778,16.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<float>,_std::complex<float>,_nullptr>
            ((EqHelper *)local_770,"M4(3,3)","T(16.0)",pcVar3,&local_778);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_770);
  if (!bVar1) {
    testing::Message::Message(&local_780);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_770);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&M4copy.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x51,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&M4copy.data_,&local_780);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&M4copy.data_);
    testing::Message::~Message(&local_780);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_770);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_38.message_,
             (SquareMatrix<std::complex<float>_> *)local_3c8);
  local_7b0 = qclab::dense::SquareMatrix<std::complex<float>_>::size
                        ((SquareMatrix<std::complex<float>_> *)&gtest_ar_38.message_);
  local_7b4 = 4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_7a8,"M4copy.size()","4",&local_7b0,&local_7b4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7a8);
  if (!bVar1) {
    testing::Message::Message(&local_7c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_39.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_39.message_,&local_7c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_39.message_);
    testing::Message::~Message(&local_7c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7a8);
  local_7e0 = qclab::dense::SquareMatrix<std::complex<float>_>::rows
                        ((SquareMatrix<std::complex<float>_> *)&gtest_ar_38.message_);
  local_7e4 = 4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_7d8,"M4copy.rows()","4",&local_7e0,&local_7e4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7d8);
  if (!bVar1) {
    testing::Message::Message(&local_7f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_40.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_40.message_,&local_7f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_40.message_);
    testing::Message::~Message(&local_7f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d8);
  local_810 = qclab::dense::SquareMatrix<std::complex<float>_>::cols
                        ((SquareMatrix<std::complex<float>_> *)&gtest_ar_38.message_);
  local_814 = 4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_808,"M4copy.cols()","4",&local_810,&local_814);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_808);
  if (!bVar1) {
    testing::Message::Message(&local_820);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_808);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_41.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x56,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_41.message_,&local_820);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_41.message_);
    testing::Message::~Message(&local_820);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_808);
  local_840 = qclab::dense::SquareMatrix<std::complex<float>_>::ld
                        ((SquareMatrix<std::complex<float>_> *)&gtest_ar_38.message_);
  local_844 = 4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_838,"M4copy.ld()","4",&local_840,&local_844);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_838);
  if (!bVar1) {
    testing::Message::Message(&local_850);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_838);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_850);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_850);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_838);
  local_869 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                        ((SquareMatrix<std::complex<float>_> *)&gtest_ar_38.message_,
                         (SquareMatrix<std::complex<float>_> *)local_3c8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_868,&local_869,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_868);
  if (!bVar1) {
    testing::Message::Message(&local_878);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&M1copy.data_,(internal *)local_868,(AssertionResult *)"M4copy == M4",
               "false","true",(char *)in_R9._M_value);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_880,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x58,pcVar2);
    testing::internal::AssertHelper::operator=(&local_880,&local_878);
    testing::internal::AssertHelper::~AssertHelper(&local_880);
    std::__cxx11::string::~string((string *)&M1copy.data_);
    testing::Message::~Message(&local_878);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_868);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_42.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_42.message_,
             (SquareMatrix<std::complex<float>_> *)&gtest_ar.message_);
  local_8c8 = qclab::dense::SquareMatrix<std::complex<float>_>::size
                        ((SquareMatrix<std::complex<float>_> *)&gtest_ar_42.message_);
  local_8cc = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_8c0,"M1copy.size()","3",&local_8c8,&local_8cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8c0);
  if (!bVar1) {
    testing::Message::Message(&local_8d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_43.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x5d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_43.message_,&local_8d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_43.message_);
    testing::Message::~Message(&local_8d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8c0);
  local_8f8 = qclab::dense::SquareMatrix<std::complex<float>_>::rows
                        ((SquareMatrix<std::complex<float>_> *)&gtest_ar_42.message_);
  local_8fc = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_8f0,"M1copy.rows()","3",&local_8f8,&local_8fc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8f0);
  if (!bVar1) {
    testing::Message::Message(&local_908);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_44.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x5e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_44.message_,&local_908);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_44.message_);
    testing::Message::~Message(&local_908);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8f0);
  local_928 = qclab::dense::SquareMatrix<std::complex<float>_>::cols
                        ((SquareMatrix<std::complex<float>_> *)&gtest_ar_42.message_);
  local_92c = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_920,"M1copy.cols()","3",&local_928,&local_92c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_920);
  if (!bVar1) {
    testing::Message::Message(&local_938);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_920);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_45.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x5f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_45.message_,&local_938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_45.message_);
    testing::Message::~Message(&local_938);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_920);
  local_958 = qclab::dense::SquareMatrix<std::complex<float>_>::ld
                        ((SquareMatrix<std::complex<float>_> *)&gtest_ar_42.message_);
  local_95c = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_950,"M1copy.ld()","3",&local_958,&local_95c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_950);
  if (!bVar1) {
    testing::Message::Message(&local_968);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_950);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x60,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_968);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_968);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_950);
  local_981 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                        ((SquareMatrix<std::complex<float>_> *)&gtest_ar_42.message_,
                         (SquareMatrix<std::complex<float>_> *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_980,&local_981,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_980);
  if (!bVar1) {
    testing::Message::Message(&local_990);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&M2copy.data_,(internal *)local_980,(AssertionResult *)"M1copy == M1",
               "false","true",(char *)in_R9._M_value);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_998,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x61,pcVar2);
    testing::internal::AssertHelper::operator=(&local_998,&local_990);
    testing::internal::AssertHelper::~AssertHelper(&local_998);
    std::__cxx11::string::~string((string *)&M2copy.data_);
    testing::Message::~Message(&local_990);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_980);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_46.message_,3);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_46.message_,
             (SquareMatrix<std::complex<float>_> *)local_130);
  local_9e0 = qclab::dense::SquareMatrix<std::complex<float>_>::size
                        ((SquareMatrix<std::complex<float>_> *)&gtest_ar_46.message_);
  local_9e4 = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_9d8,"M2copy.size()","3",&local_9e0,&local_9e4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9d8);
  if (!bVar1) {
    testing::Message::Message(&local_9f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_47.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x65,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_47.message_,&local_9f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_47.message_);
    testing::Message::~Message(&local_9f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9d8);
  local_a10 = qclab::dense::SquareMatrix<std::complex<float>_>::rows
                        ((SquareMatrix<std::complex<float>_> *)&gtest_ar_46.message_);
  local_a14 = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_a08,"M2copy.rows()","3",&local_a10,&local_a14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a08);
  if (!bVar1) {
    testing::Message::Message(&local_a20);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a08);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_48.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x66,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_48.message_,&local_a20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_48.message_);
    testing::Message::~Message(&local_a20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a08);
  local_a40 = qclab::dense::SquareMatrix<std::complex<float>_>::cols
                        ((SquareMatrix<std::complex<float>_> *)&gtest_ar_46.message_);
  local_a44 = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_a38,"M2copy.cols()","3",&local_a40,&local_a44);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a38);
  if (!bVar1) {
    testing::Message::Message(&local_a50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_49.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x67,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_49.message_,&local_a50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_49.message_);
    testing::Message::~Message(&local_a50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a38);
  local_a70 = qclab::dense::SquareMatrix<std::complex<float>_>::ld
                        ((SquareMatrix<std::complex<float>_> *)&gtest_ar_46.message_);
  local_a74 = 3;
  cVar5._M_value = (_ComplexT)&local_a74;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_a68,"M2copy.ld()","3",&local_a70,(int *)cVar5._M_value);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a68);
  if (!bVar1) {
    testing::Message::Message(&local_a80);
    cVar5._M_value =
         (_ComplexT)testing::AssertionResult::failure_message((AssertionResult *)local_a68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x68,(char *)cVar5._M_value);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_a80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_a80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a68);
  local_a99 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                        ((SquareMatrix<std::complex<float>_> *)&gtest_ar_46.message_,
                         (SquareMatrix<std::complex<float>_> *)local_130);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a98,&local_a99,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a98);
  if (!bVar1) {
    testing::Message::Message(&local_aa8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_a98,
               (AssertionResult *)"M2copy == M2","false","true",(char *)in_R9._M_value);
    cVar5._M_value = std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ab0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x69,(char *)cVar5._M_value);
    testing::internal::AssertHelper::operator=(&local_ab0,&local_aa8);
    testing::internal::AssertHelper::~AssertHelper(&local_ab0);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_aa8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a98);
  local_ae1 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                        ((SquareMatrix<std::complex<float>_> *)local_130,
                         (SquareMatrix<std::complex<float>_> *)local_130);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ae0,&local_ae1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ae0);
  if (!bVar1) {
    testing::Message::Message(&local_af0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_ae0,(AssertionResult *)"M2 == M2",
               "false","true",(char *)in_R9._M_value);
    cVar5._M_value = std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_af8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6c,(char *)cVar5._M_value);
    testing::internal::AssertHelper::operator=(&local_af8,&local_af0);
    testing::internal::AssertHelper::~AssertHelper(&local_af8);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_af0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ae0);
  bVar1 = qclab::dense::SquareMatrix<std::complex<float>_>::operator!=
                    ((SquareMatrix<std::complex<float>_> *)local_130,
                     (SquareMatrix<std::complex<float>_> *)local_130);
  local_b29 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b28,&local_b29,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b28);
  if (!bVar1) {
    testing::Message::Message(&local_b38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_b28,(AssertionResult *)"M2 != M2",
               "true","false",(char *)in_R9._M_value);
    cVar5._M_value = std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6c,(char *)cVar5._M_value);
    testing::internal::AssertHelper::operator=(&local_b40,&local_b38);
    testing::internal::AssertHelper::~AssertHelper(&local_b40);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_b38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b28);
  local_b71 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                        ((SquareMatrix<std::complex<float>_> *)local_238,
                         (SquareMatrix<std::complex<float>_> *)local_238);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b70,&local_b71,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b70);
  if (!bVar1) {
    testing::Message::Message(&local_b80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_b70,(AssertionResult *)"M3 == M3",
               "false","true",(char *)in_R9._M_value);
    cVar5._M_value = std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6d,(char *)cVar5._M_value);
    testing::internal::AssertHelper::operator=(&local_b88,&local_b80);
    testing::internal::AssertHelper::~AssertHelper(&local_b88);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_b80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b70);
  bVar1 = qclab::dense::SquareMatrix<std::complex<float>_>::operator!=
                    ((SquareMatrix<std::complex<float>_> *)local_238,
                     (SquareMatrix<std::complex<float>_> *)local_238);
  local_bb9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_bb8,&local_bb9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bb8);
  if (!bVar1) {
    testing::Message::Message(&local_bc8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_bb8,(AssertionResult *)"M3 != M3",
               "true","false",(char *)in_R9._M_value);
    cVar5._M_value = std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_bd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6d,(char *)cVar5._M_value);
    testing::internal::AssertHelper::operator=(&local_bd0,&local_bc8);
    testing::internal::AssertHelper::~AssertHelper(&local_bd0);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_bc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bb8);
  local_c01 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                        ((SquareMatrix<std::complex<float>_> *)local_3c8,
                         (SquareMatrix<std::complex<float>_> *)local_3c8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c00,&local_c01,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c00);
  if (!bVar1) {
    testing::Message::Message(&local_c10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_c00,(AssertionResult *)"M4 == M4",
               "false","true",(char *)in_R9._M_value);
    cVar5._M_value = std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6e,(char *)cVar5._M_value);
    testing::internal::AssertHelper::operator=(&local_c18,&local_c10);
    testing::internal::AssertHelper::~AssertHelper(&local_c18);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_c10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c00);
  bVar1 = qclab::dense::SquareMatrix<std::complex<float>_>::operator!=
                    ((SquareMatrix<std::complex<float>_> *)local_3c8,
                     (SquareMatrix<std::complex<float>_> *)local_3c8);
  local_c49 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c48,&local_c49,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c48);
  if (!bVar1) {
    testing::Message::Message(&local_c58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_c48,(AssertionResult *)"M4 != M4",
               "true","false",(char *)in_R9._M_value);
    cVar5._M_value = std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6e,(char *)cVar5._M_value);
    testing::internal::AssertHelper::operator=(&local_c60,&local_c58);
    testing::internal::AssertHelper::~AssertHelper(&local_c60);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_c58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c48);
  local_c91 = qclab::dense::SquareMatrix<std::complex<float>_>::operator!=
                        ((SquareMatrix<std::complex<float>_> *)local_130,
                         (SquareMatrix<std::complex<float>_> *)local_238);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c90,&local_c91,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c90);
  if (!bVar1) {
    testing::Message::Message(&local_ca0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_c90,(AssertionResult *)"M2 != M3",
               "false","true",(char *)in_R9._M_value);
    cVar5._M_value = std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ca8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6f,(char *)cVar5._M_value);
    testing::internal::AssertHelper::operator=(&local_ca8,&local_ca0);
    testing::internal::AssertHelper::~AssertHelper(&local_ca8);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_ca0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c90);
  bVar1 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                    ((SquareMatrix<std::complex<float>_> *)local_130,
                     (SquareMatrix<std::complex<float>_> *)local_238);
  local_cd9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_cd8,&local_cd9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cd8);
  if (!bVar1) {
    testing::Message::Message(&local_ce8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_cd8,(AssertionResult *)"M2 == M3",
               "true","false",(char *)in_R9._M_value);
    cVar5._M_value = std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_cf0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x6f,(char *)cVar5._M_value);
    testing::internal::AssertHelper::operator=(&local_cf0,&local_ce8);
    testing::internal::AssertHelper::~AssertHelper(&local_cf0);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_ce8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cd8);
  local_d21 = qclab::dense::SquareMatrix<std::complex<float>_>::operator!=
                        ((SquareMatrix<std::complex<float>_> *)local_238,
                         (SquareMatrix<std::complex<float>_> *)local_3c8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d20,&local_d21,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d20);
  if (!bVar1) {
    testing::Message::Message(&local_d30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__12.message_,(internal *)local_d20,(AssertionResult *)"M3 != M4",
               "false","true",(char *)in_R9._M_value);
    cVar5._M_value = std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x70,(char *)cVar5._M_value);
    testing::internal::AssertHelper::operator=(&local_d38,&local_d30);
    testing::internal::AssertHelper::~AssertHelper(&local_d38);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(&local_d30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d20);
  bVar1 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                    ((SquareMatrix<std::complex<float>_> *)local_238,
                     (SquareMatrix<std::complex<float>_> *)local_3c8);
  local_d69[0] = ~bVar1 & 1;
  cVar4._M_value = (_ComplexT)local_d69;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)(local_d69 + 1),(bool *)cVar4._M_value,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_d69 + 1));
  if (!bVar1) {
    testing::Message::Message(&local_d78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&M5.data_,(internal *)(local_d69 + 1),(AssertionResult *)"M3 == M4","true",
               "false",(char *)in_R9._M_value);
    cVar5._M_value = std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x70,(char *)cVar5._M_value);
    cVar4._M_value = (_ComplexT)&local_d78;
    testing::internal::AssertHelper::operator=(&local_d80,(Message *)cVar4._M_value);
    testing::internal::AssertHelper::~AssertHelper(&local_d80);
    std::__cxx11::string::~string((string *)&M5.data_);
    testing::Message::~Message(&local_d78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_d69 + 1));
  std::complex<float>::complex(&local_db8,1.0,0.0);
  std::complex<float>::complex(&local_dc0,2.0,0.0);
  std::complex<float>::complex(&local_dc8,3.0,0.0);
  std::complex<float>::complex(&local_dd0,4.0,0.0);
  std::complex<float>::complex(&local_dd8,5.0,0.0);
  std::complex<float>::complex(&local_de0,6.0,0.0);
  std::complex<float>::complex(&local_de8,0.0,0.0);
  std::complex<float>::complex(&local_df0,8.0,0.0);
  std::complex<float>::complex(&local_df8,9.0,0.0);
  std::complex<float>::complex(&local_e00,10.0,0.0);
  std::complex<float>::complex(&local_e08,11.0,0.0);
  std::complex<float>::complex(&local_e10,12.0,0.0);
  std::complex<float>::complex(&local_e18,13.0,0.0);
  std::complex<float>::complex(&local_e20,14.0,0.0);
  std::complex<float>::complex(&local_e28,15.0,0.0);
  std::complex<float>::complex((complex<float> *)&gtest_ar__13.message_,16.0,0.0);
  cVar6._M_value._2_1_ = in_stack_ffffffffffffe03a;
  cVar6._M_value._0_2_ = in_stack_ffffffffffffe038;
  cVar6._M_value._3_1_ = in_stack_ffffffffffffe03b;
  cVar6._M_value._4_1_ = in_stack_ffffffffffffe03c;
  cVar6._M_value._5_1_ = in_stack_ffffffffffffe03d;
  cVar6._M_value._6_1_ = in_stack_ffffffffffffe03e;
  cVar6._M_value._7_1_ = in_stack_ffffffffffffe03f;
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_db0,cVar4,m01_01,local_df8,cVar5,in_R9,
             local_df8,local_e00,local_e08,local_e10,local_e18,local_e20,local_e28,
             (complex<float>)
             gtest_ar__13.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,cVar6,in_stack_ffffffffffffe040,in_stack_ffffffffffffe048);
  local_e41 = qclab::dense::SquareMatrix<std::complex<float>_>::operator!=
                        ((SquareMatrix<std::complex<float>_> *)local_3c8,
                         (SquareMatrix<std::complex<float>_> *)local_db0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e40,&local_e41,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e40);
  cVar4._M_value = local_df8._M_value;
  if (!bVar1) {
    testing::Message::Message(&local_e50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__14.message_,(internal *)local_e40,(AssertionResult *)"M4 != M5",
               "false","true",(char *)in_R9._M_value);
    cVar5._M_value = std::__cxx11::string::c_str();
    cVar4._M_value = 0x76;
    testing::internal::AssertHelper::AssertHelper
              (&local_e58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x76,(char *)cVar5._M_value);
    testing::internal::AssertHelper::operator=(&local_e58,&local_e50);
    testing::internal::AssertHelper::~AssertHelper(&local_e58);
    std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
    testing::Message::~Message(&local_e50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e40);
  bVar1 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                    ((SquareMatrix<std::complex<float>_> *)local_3c8,
                     (SquareMatrix<std::complex<float>_> *)local_db0);
  local_e89 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e88,&local_e89,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e88);
  if (!bVar1) {
    testing::Message::Message(&local_e98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__15.message_,(internal *)local_e88,(AssertionResult *)"M4 == M5",
               "true","false",(char *)in_R9._M_value);
    cVar5._M_value = std::__cxx11::string::c_str();
    cVar4._M_value = 0x76;
    testing::internal::AssertHelper::AssertHelper
              (&local_ea0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x76,(char *)cVar5._M_value);
    testing::internal::AssertHelper::operator=(&local_ea0,&local_e98);
    testing::internal::AssertHelper::~AssertHelper(&local_ea0);
    std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
    testing::Message::~Message(&local_e98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e88);
  pcVar3 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)local_db0,1,2);
  std::complex<float>::operator=(pcVar3,7.0);
  local_ed1 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                        ((SquareMatrix<std::complex<float>_> *)local_3c8,
                         (SquareMatrix<std::complex<float>_> *)local_db0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ed0,&local_ed1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ed0);
  if (!bVar1) {
    testing::Message::Message(&local_ee0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__16.message_,(internal *)local_ed0,(AssertionResult *)"M4 == M5",
               "false","true",(char *)in_R9._M_value);
    cVar5._M_value = std::__cxx11::string::c_str();
    cVar4._M_value = 0x78;
    testing::internal::AssertHelper::AssertHelper
              (&local_ee8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x78,(char *)cVar5._M_value);
    testing::internal::AssertHelper::operator=(&local_ee8,&local_ee0);
    testing::internal::AssertHelper::~AssertHelper(&local_ee8);
    std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
    testing::Message::~Message(&local_ee0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ed0);
  bVar1 = qclab::dense::SquareMatrix<std::complex<float>_>::operator!=
                    ((SquareMatrix<std::complex<float>_> *)local_3c8,
                     (SquareMatrix<std::complex<float>_> *)local_db0);
  local_f19[0] = ~bVar1 & 1;
  cVar6._M_value = (_ComplexT)local_f19;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)(local_f19 + 1),(bool *)cVar6._M_value,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_f19 + 1));
  if (!bVar1) {
    testing::Message::Message(&local_f28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&A.data_,(internal *)(local_f19 + 1),(AssertionResult *)"M4 != M5","true",
               "false",(char *)in_R9._M_value);
    cVar5._M_value = std::__cxx11::string::c_str();
    cVar4._M_value = 0x78;
    testing::internal::AssertHelper::AssertHelper
              (&local_f30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x78,(char *)cVar5._M_value);
    cVar6._M_value = (_ComplexT)&local_f28;
    testing::internal::AssertHelper::operator=(&local_f30,(Message *)cVar6._M_value);
    testing::internal::AssertHelper::~AssertHelper(&local_f30);
    std::__cxx11::string::~string((string *)&A.data_);
    testing::Message::~Message(&local_f28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_f19 + 1));
  std::complex<float>::complex(&local_f68,1.0,0.0);
  std::complex<float>::complex(&local_f70,2.0,0.0);
  std::complex<float>::complex(&local_f78,3.0,0.0);
  std::complex<float>::complex((complex<float> *)&B.data_,4.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_f60,cVar6,m01_02,cVar4,cVar5);
  std::complex<float>::complex(&local_f98,5.0,0.0);
  std::complex<float>::complex(&local_fa0,7.0,0.0);
  std::complex<float>::complex(&local_fa8,6.0,0.0);
  std::complex<float>::complex((complex<float> *)&C.data_,8.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_f90,cVar6,m01_03,cVar4,cVar5);
  std::complex<float>::complex(&local_fc8,9.0,0.0);
  std::complex<float>::complex(&local_fd0,11.0,0.0);
  std::complex<float>::complex(&local_fd8,10.0,0.0);
  std::complex<float>::complex((complex<float> *)&D.data_,12.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_fc0,cVar6,m01_04,cVar4,cVar5);
  std::complex<float>::complex(&local_ff8,13.0,0.0);
  std::complex<float>::complex(&local_1000,14.0,0.0);
  std::complex<float>::complex(&local_1008,15.0,0.0);
  std::complex<float>::complex((complex<float> *)&sumAB_check.data_,16.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_ff0,cVar6,m01_05,cVar4,cVar5);
  std::complex<float>::complex(&local_1028,6.0,0.0);
  std::complex<float>::complex(&local_1030,9.0,0.0);
  std::complex<float>::complex(&local_1038,9.0,0.0);
  std::complex<float>::complex((complex<float> *)&sumABC_check.data_,12.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1020,cVar6,m01_06,cVar4,cVar5);
  std::complex<float>::complex(&local_1058,15.0,0.0);
  std::complex<float>::complex(&local_1060,20.0,0.0);
  std::complex<float>::complex(&local_1068,19.0,0.0);
  std::complex<float>::complex((complex<float> *)&sumABCD_check.data_,24.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1050,cVar6,m01_07,cVar4,cVar5);
  std::complex<float>::complex(&local_1088,28.0,0.0);
  std::complex<float>::complex(&local_1090,34.0,0.0);
  std::complex<float>::complex(&local_1098,34.0,0.0);
  std::complex<float>::complex((complex<float> *)&sumAB.data_,40.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1080,cVar6,m01_08,cVar4,cVar5);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_50.message_,
             (SquareMatrix<std::complex<float>_> *)local_f60);
  qclab::dense::operator+
            ((dense *)local_10b0,(SquareMatrix<std::complex<float>_> *)&gtest_ar_50.message_,
             (SquareMatrix<std::complex<float>_> *)local_f90);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_50.message_);
  local_10d8 = qclab::dense::SquareMatrix<std::complex<float>_>::size
                         ((SquareMatrix<std::complex<float>_> *)local_10b0);
  local_10dc = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_10d0,"sumAB.size()","2",&local_10d8,&local_10dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10d0);
  if (!bVar1) {
    testing::Message::Message(&local_10e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_10d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x8c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__17.message_,&local_10e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__17.message_);
    testing::Message::~Message(&local_10e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10d0);
  local_1101 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                         ((SquareMatrix<std::complex<float>_> *)local_10b0,
                          (SquareMatrix<std::complex<float>_> *)local_1020);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1100,&local_1101,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1100);
  if (!bVar1) {
    testing::Message::Message(&local_1110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sumABC.data_,(internal *)local_1100,
               (AssertionResult *)"sumAB == sumAB_check","false","true",(char *)in_R9._M_value);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x8d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1118,&local_1110);
    testing::internal::AssertHelper::~AssertHelper(&local_1118);
    std::__cxx11::string::~string((string *)&sumABC.data_);
    testing::Message::~Message(&local_1110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1100);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_51.message_,
             (SquareMatrix<std::complex<float>_> *)local_f60);
  qclab::dense::operator+
            ((dense *)&local_1158,(SquareMatrix<std::complex<float>_> *)&gtest_ar_51.message_,
             (SquareMatrix<std::complex<float>_> *)local_f90);
  qclab::dense::operator+
            ((dense *)local_1148,&local_1158,(SquareMatrix<std::complex<float>_> *)local_fc0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1158);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_51.message_);
  local_1180 = qclab::dense::SquareMatrix<std::complex<float>_>::size
                         ((SquareMatrix<std::complex<float>_> *)local_1148);
  local_1184 = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_1178,"sumABC.size()","2",&local_1180,&local_1184);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1178);
  if (!bVar1) {
    testing::Message::Message(&local_1190);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x90,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__18.message_,&local_1190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__18.message_);
    testing::Message::~Message(&local_1190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1178);
  local_11a9 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                         ((SquareMatrix<std::complex<float>_> *)local_1148,
                          (SquareMatrix<std::complex<float>_> *)local_1050);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_11a8,&local_11a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11a8);
  if (!bVar1) {
    testing::Message::Message(&local_11b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sumABCD.data_,(internal *)local_11a8,
               (AssertionResult *)"sumABC == sumABC_check","false","true",(char *)in_R9._M_value);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_11c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x91,pcVar2);
    testing::internal::AssertHelper::operator=(&local_11c0,&local_11b8);
    testing::internal::AssertHelper::~AssertHelper(&local_11c0);
    std::__cxx11::string::~string((string *)&sumABCD.data_);
    testing::Message::~Message(&local_11b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11a8);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_52.message_,
             (SquareMatrix<std::complex<float>_> *)local_f60);
  qclab::dense::operator+
            ((dense *)&local_1210,(SquareMatrix<std::complex<float>_> *)&gtest_ar_52.message_,
             (SquareMatrix<std::complex<float>_> *)local_f90);
  qclab::dense::operator+
            ((dense *)&local_1200,&local_1210,(SquareMatrix<std::complex<float>_> *)local_fc0);
  qclab::dense::operator+
            ((dense *)local_11f0,&local_1200,(SquareMatrix<std::complex<float>_> *)local_ff0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1200);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1210);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_52.message_);
  local_1238 = qclab::dense::SquareMatrix<std::complex<float>_>::size
                         ((SquareMatrix<std::complex<float>_> *)local_11f0);
  local_123c = 2;
  cVar5._M_value = (_ComplexT)&local_1238;
  cVar4._M_value = (_ComplexT)&local_123c;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_1230,"sumABCD.size()","2",(long *)cVar5._M_value,
             (int *)cVar4._M_value);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1230);
  if (!bVar1) {
    testing::Message::Message(&local_1248);
    cVar4._M_value =
         (_ComplexT)testing::AssertionResult::failure_message((AssertionResult *)local_1230);
    cVar5._M_value = 0x94;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x94,(char *)cVar4._M_value);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__19.message_,&local_1248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__19.message_);
    testing::Message::~Message(&local_1248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1230);
  local_1261 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                         ((SquareMatrix<std::complex<float>_> *)local_11f0,
                          (SquareMatrix<std::complex<float>_> *)local_1080);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1260,&local_1261,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1260);
  if (!bVar1) {
    testing::Message::Message(&local_1270);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sum.data_,(internal *)local_1260,
               (AssertionResult *)"sumABCD == sumABCD_check","false","true",(char *)in_R9._M_value);
    cVar4._M_value = std::__cxx11::string::c_str();
    cVar5._M_value = 0x95;
    testing::internal::AssertHelper::AssertHelper
              (&local_1278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x95,(char *)cVar4._M_value);
    testing::internal::AssertHelper::operator=(&local_1278,&local_1270);
    testing::internal::AssertHelper::~AssertHelper(&local_1278);
    std::__cxx11::string::~string((string *)&sum.data_);
    testing::Message::~Message(&local_1270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1260);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__20.message_,
             (SquareMatrix<std::complex<float>_> *)local_f60);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator+=
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__20.message_,
             (SquareMatrix<std::complex<float>_> *)local_f90);
  local_12b9 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                         ((SquareMatrix<std::complex<float>_> *)&gtest_ar__20.message_,
                          (SquareMatrix<std::complex<float>_> *)local_1020);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_12b8,&local_12b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12b8);
  if (!bVar1) {
    testing::Message::Message(&local_12c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__21.message_,(internal *)local_12b8,
               (AssertionResult *)"sum == sumAB_check","false","true",(char *)in_R9._M_value);
    cVar4._M_value = std::__cxx11::string::c_str();
    cVar5._M_value = 0x98;
    testing::internal::AssertHelper::AssertHelper
              (&local_12d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x98,(char *)cVar4._M_value);
    testing::internal::AssertHelper::operator=(&local_12d0,&local_12c8);
    testing::internal::AssertHelper::~AssertHelper(&local_12d0);
    std::__cxx11::string::~string((string *)&gtest_ar__21.message_);
    testing::Message::~Message(&local_12c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12b8);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator+=
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__20.message_,
             (SquareMatrix<std::complex<float>_> *)local_fc0);
  local_1301 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                         ((SquareMatrix<std::complex<float>_> *)&gtest_ar__20.message_,
                          (SquareMatrix<std::complex<float>_> *)local_1050);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1300,&local_1301,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1300);
  if (!bVar1) {
    testing::Message::Message(&local_1310);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__22.message_,(internal *)local_1300,
               (AssertionResult *)"sum == sumABC_check","false","true",(char *)in_R9._M_value);
    cVar4._M_value = std::__cxx11::string::c_str();
    cVar5._M_value = 0x99;
    testing::internal::AssertHelper::AssertHelper
              (&local_1318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x99,(char *)cVar4._M_value);
    testing::internal::AssertHelper::operator=(&local_1318,&local_1310);
    testing::internal::AssertHelper::~AssertHelper(&local_1318);
    std::__cxx11::string::~string((string *)&gtest_ar__22.message_);
    testing::Message::~Message(&local_1310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1300);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator+=
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__20.message_,
             (SquareMatrix<std::complex<float>_> *)local_ff0);
  local_1349[0] =
       qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                 ((SquareMatrix<std::complex<float>_> *)&gtest_ar__20.message_,
                  (SquareMatrix<std::complex<float>_> *)local_1080);
  cVar6._M_value = (_ComplexT)local_1349;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)(local_1349 + 1),(bool *)cVar6._M_value,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_1349 + 1));
  if (!bVar1) {
    testing::Message::Message(&local_1358);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&minusAB_check.data_,(internal *)(local_1349 + 1),
               (AssertionResult *)"sum == sumABCD_check","false","true",(char *)in_R9._M_value);
    cVar4._M_value = std::__cxx11::string::c_str();
    cVar5._M_value = 0x9a;
    testing::internal::AssertHelper::AssertHelper
              (&local_1360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0x9a,(char *)cVar4._M_value);
    cVar6._M_value = (_ComplexT)&local_1358;
    testing::internal::AssertHelper::operator=(&local_1360,(Message *)cVar6._M_value);
    testing::internal::AssertHelper::~AssertHelper(&local_1360);
    std::__cxx11::string::~string((string *)&minusAB_check.data_);
    testing::Message::~Message(&local_1358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_1349 + 1));
  std::complex<float>::complex(&local_1398,-4.0,0.0);
  std::complex<float>::complex(&local_13a0,-5.0,0.0);
  std::complex<float>::complex(&local_13a8,-3.0,0.0);
  std::complex<float>::complex((complex<float> *)&minusABC_check.data_,-4.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1390,cVar6,m01_09,cVar5,cVar4);
  std::complex<float>::complex(&local_13c8,-13.0,0.0);
  std::complex<float>::complex(&local_13d0,-16.0,0.0);
  std::complex<float>::complex(&local_13d8,-13.0,0.0);
  std::complex<float>::complex((complex<float> *)&minusABCD_check.data_,-16.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_13c0,cVar6,m01_10,cVar5,cVar4);
  std::complex<float>::complex(&local_13f8,-26.0,0.0);
  std::complex<float>::complex(&local_1400,-30.0,0.0);
  std::complex<float>::complex(&local_1408,-28.0,0.0);
  std::complex<float>::complex((complex<float> *)&minusAB.data_,-32.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_13f0,cVar6,m01_11,cVar5,cVar4);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_53.message_,
             (SquareMatrix<std::complex<float>_> *)local_f60);
  qclab::dense::operator-
            ((dense *)local_1420,(SquareMatrix<std::complex<float>_> *)&gtest_ar_53.message_,
             (SquareMatrix<std::complex<float>_> *)local_f90);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_53.message_);
  local_1448 = qclab::dense::SquareMatrix<std::complex<float>_>::size
                         ((SquareMatrix<std::complex<float>_> *)local_1420);
  local_144c = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_1440,"minusAB.size()","2",&local_1448,&local_144c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1440);
  if (!bVar1) {
    testing::Message::Message(&local_1458);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1440);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xa4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__23.message_,&local_1458);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__23.message_);
    testing::Message::~Message(&local_1458);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1440);
  local_1471 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                         ((SquareMatrix<std::complex<float>_> *)local_1420,
                          (SquareMatrix<std::complex<float>_> *)local_1390);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1470,&local_1471,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1470);
  if (!bVar1) {
    testing::Message::Message(&local_1480);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&minusABC.data_,(internal *)local_1470,
               (AssertionResult *)"minusAB == minusAB_check","false","true",(char *)in_R9._M_value);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1488,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xa5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1488,&local_1480);
    testing::internal::AssertHelper::~AssertHelper(&local_1488);
    std::__cxx11::string::~string((string *)&minusABC.data_);
    testing::Message::~Message(&local_1480);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1470);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_54.message_,
             (SquareMatrix<std::complex<float>_> *)local_f60);
  qclab::dense::operator-
            ((dense *)&local_14c8,(SquareMatrix<std::complex<float>_> *)&gtest_ar_54.message_,
             (SquareMatrix<std::complex<float>_> *)local_f90);
  qclab::dense::operator-
            ((dense *)local_14b8,&local_14c8,(SquareMatrix<std::complex<float>_> *)local_fc0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_14c8);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_54.message_);
  local_14f0 = qclab::dense::SquareMatrix<std::complex<float>_>::size
                         ((SquareMatrix<std::complex<float>_> *)local_14b8);
  local_14f4 = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_14e8,"minusABC.size()","2",&local_14f0,&local_14f4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14e8);
  if (!bVar1) {
    testing::Message::Message(&local_1500);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_14e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xa8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__24.message_,&local_1500);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__24.message_);
    testing::Message::~Message(&local_1500);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_14e8);
  local_1519 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                         ((SquareMatrix<std::complex<float>_> *)local_14b8,
                          (SquareMatrix<std::complex<float>_> *)local_13c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1518,&local_1519,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1518);
  if (!bVar1) {
    testing::Message::Message(&local_1528);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&minusABCD.data_,(internal *)local_1518,
               (AssertionResult *)"minusABC == minusABC_check","false","true",(char *)in_R9._M_value
              );
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1530,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xa9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1530,&local_1528);
    testing::internal::AssertHelper::~AssertHelper(&local_1530);
    std::__cxx11::string::~string((string *)&minusABCD.data_);
    testing::Message::~Message(&local_1528);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1518);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_55.message_,
             (SquareMatrix<std::complex<float>_> *)local_f60);
  qclab::dense::operator-
            ((dense *)&local_1580,(SquareMatrix<std::complex<float>_> *)&gtest_ar_55.message_,
             (SquareMatrix<std::complex<float>_> *)local_f90);
  qclab::dense::operator-
            ((dense *)&local_1570,&local_1580,(SquareMatrix<std::complex<float>_> *)local_fc0);
  qclab::dense::operator-
            ((dense *)local_1560,&local_1570,(SquareMatrix<std::complex<float>_> *)local_ff0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1570);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1580);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_55.message_);
  local_15a8 = qclab::dense::SquareMatrix<std::complex<float>_>::size
                         ((SquareMatrix<std::complex<float>_> *)local_1560);
  local_15ac = 2;
  cVar5._M_value = (_ComplexT)&local_15a8;
  cVar4._M_value = (_ComplexT)&local_15ac;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_15a0,"minusABCD.size()","2",(long *)cVar5._M_value,
             (int *)cVar4._M_value);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_15a0);
  if (!bVar1) {
    testing::Message::Message(&local_15b8);
    cVar4._M_value =
         (_ComplexT)testing::AssertionResult::failure_message((AssertionResult *)local_15a0);
    cVar5._M_value = 0xac;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xac,(char *)cVar4._M_value);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__25.message_,&local_15b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__25.message_);
    testing::Message::~Message(&local_15b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_15a0);
  local_15d1 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                         ((SquareMatrix<std::complex<float>_> *)local_1560,
                          (SquareMatrix<std::complex<float>_> *)local_13f0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_15d0,&local_15d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_15d0);
  if (!bVar1) {
    testing::Message::Message(&local_15e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&minus.data_,(internal *)local_15d0,
               (AssertionResult *)"minusABCD == minusABCD_check","false","true",
               (char *)in_R9._M_value);
    cVar4._M_value = std::__cxx11::string::c_str();
    cVar5._M_value = 0xad;
    testing::internal::AssertHelper::AssertHelper
              (&local_15e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xad,(char *)cVar4._M_value);
    testing::internal::AssertHelper::operator=(&local_15e8,&local_15e0);
    testing::internal::AssertHelper::~AssertHelper(&local_15e8);
    std::__cxx11::string::~string((string *)&minus.data_);
    testing::Message::~Message(&local_15e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_15d0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__26.message_,
             (SquareMatrix<std::complex<float>_> *)local_f60);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator-=
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__26.message_,
             (SquareMatrix<std::complex<float>_> *)local_f90);
  local_1629 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                         ((SquareMatrix<std::complex<float>_> *)&gtest_ar__26.message_,
                          (SquareMatrix<std::complex<float>_> *)local_1390);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1628,&local_1629,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1628);
  if (!bVar1) {
    testing::Message::Message(&local_1638);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__27.message_,(internal *)local_1628,
               (AssertionResult *)"minus == minusAB_check","false","true",(char *)in_R9._M_value);
    cVar4._M_value = std::__cxx11::string::c_str();
    cVar5._M_value = 0xb0;
    testing::internal::AssertHelper::AssertHelper
              (&local_1640,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xb0,(char *)cVar4._M_value);
    testing::internal::AssertHelper::operator=(&local_1640,&local_1638);
    testing::internal::AssertHelper::~AssertHelper(&local_1640);
    std::__cxx11::string::~string((string *)&gtest_ar__27.message_);
    testing::Message::~Message(&local_1638);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1628);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator-=
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__26.message_,
             (SquareMatrix<std::complex<float>_> *)local_fc0);
  local_1671 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                         ((SquareMatrix<std::complex<float>_> *)&gtest_ar__26.message_,
                          (SquareMatrix<std::complex<float>_> *)local_13c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1670,&local_1671,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1670);
  if (!bVar1) {
    testing::Message::Message(&local_1680);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__28.message_,(internal *)local_1670,
               (AssertionResult *)"minus == minusABC_check","false","true",(char *)in_R9._M_value);
    cVar4._M_value = std::__cxx11::string::c_str();
    cVar5._M_value = 0xb1;
    testing::internal::AssertHelper::AssertHelper
              (&local_1688,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xb1,(char *)cVar4._M_value);
    testing::internal::AssertHelper::operator=(&local_1688,&local_1680);
    testing::internal::AssertHelper::~AssertHelper(&local_1688);
    std::__cxx11::string::~string((string *)&gtest_ar__28.message_);
    testing::Message::~Message(&local_1680);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1670);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator-=
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__26.message_,
             (SquareMatrix<std::complex<float>_> *)local_ff0);
  local_16b9[0] =
       qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                 ((SquareMatrix<std::complex<float>_> *)&gtest_ar__26.message_,
                  (SquareMatrix<std::complex<float>_> *)local_13f0);
  cVar6._M_value = (_ComplexT)local_16b9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)(local_16b9 + 1),(bool *)cVar6._M_value,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_16b9 + 1));
  if (!bVar1) {
    testing::Message::Message(&local_16c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&prodAB_check.data_,(internal *)(local_16b9 + 1),
               (AssertionResult *)"minus == minusABCD_check","false","true",(char *)in_R9._M_value);
    cVar4._M_value = std::__cxx11::string::c_str();
    cVar5._M_value = 0xb2;
    testing::internal::AssertHelper::AssertHelper
              (&local_16d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xb2,(char *)cVar4._M_value);
    cVar6._M_value = (_ComplexT)&local_16c8;
    testing::internal::AssertHelper::operator=(&local_16d0,(Message *)cVar6._M_value);
    testing::internal::AssertHelper::~AssertHelper(&local_16d0);
    std::__cxx11::string::~string((string *)&prodAB_check.data_);
    testing::Message::~Message(&local_16c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_16b9 + 1));
  std::complex<float>::complex(&local_1708,17.0,0.0);
  std::complex<float>::complex(&local_1710,23.0,0.0);
  std::complex<float>::complex(&local_1718,39.0,0.0);
  std::complex<float>::complex((complex<float> *)&prodABC_check.data_,53.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1700,cVar6,m01_12,cVar5,cVar4);
  std::complex<float>::complex(&local_1738,383.0,0.0);
  std::complex<float>::complex(&local_1740,463.0,0.0);
  std::complex<float>::complex(&local_1748,881.0,0.0);
  std::complex<float>::complex((complex<float> *)&prodABCD_check.data_,1065.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1730,cVar6,m01_13,cVar5,cVar4);
  std::complex<float>::complex(&local_1768,11924.0,0.0);
  std::complex<float>::complex(&local_1770,12770.0,0.0);
  std::complex<float>::complex(&local_1778,27428.0,0.0);
  std::complex<float>::complex((complex<float> *)&prodAB.data_,29374.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1760,cVar6,m01_14,cVar5,cVar4);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_56.message_,
             (SquareMatrix<std::complex<float>_> *)local_f60);
  qclab::dense::operator*
            ((dense *)local_1790,(SquareMatrix<std::complex<float>_> *)&gtest_ar_56.message_,
             (SquareMatrix<std::complex<float>_> *)local_f90);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_56.message_);
  local_17b8 = qclab::dense::SquareMatrix<std::complex<float>_>::size
                         ((SquareMatrix<std::complex<float>_> *)local_1790);
  local_17bc = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_17b0,"prodAB.size()","2",&local_17b8,&local_17bc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_17b0);
  if (!bVar1) {
    testing::Message::Message(&local_17c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_17b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xbc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__29.message_,&local_17c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__29.message_);
    testing::Message::~Message(&local_17c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_17b0);
  local_17e1 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                         ((SquareMatrix<std::complex<float>_> *)local_1790,
                          (SquareMatrix<std::complex<float>_> *)local_1700);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_17e0,&local_17e1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_17e0);
  if (!bVar1) {
    testing::Message::Message(&local_17f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&prodABC.data_,(internal *)local_17e0,
               (AssertionResult *)"prodAB == prodAB_check","false","true",(char *)in_R9._M_value);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_17f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xbd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_17f8,&local_17f0);
    testing::internal::AssertHelper::~AssertHelper(&local_17f8);
    std::__cxx11::string::~string((string *)&prodABC.data_);
    testing::Message::~Message(&local_17f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_17e0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_57.message_,
             (SquareMatrix<std::complex<float>_> *)local_f60);
  qclab::dense::operator*
            ((dense *)&local_1838,(SquareMatrix<std::complex<float>_> *)&gtest_ar_57.message_,
             (SquareMatrix<std::complex<float>_> *)local_f90);
  qclab::dense::operator*
            ((dense *)local_1828,&local_1838,(SquareMatrix<std::complex<float>_> *)local_fc0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1838);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_57.message_);
  local_1860 = qclab::dense::SquareMatrix<std::complex<float>_>::size
                         ((SquareMatrix<std::complex<float>_> *)local_1828);
  local_1864 = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_1858,"prodABC.size()","2",&local_1860,&local_1864);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1858);
  if (!bVar1) {
    testing::Message::Message(&local_1870);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1858);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__30.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xc0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__30.message_,&local_1870);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__30.message_);
    testing::Message::~Message(&local_1870);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1858);
  local_1889 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                         ((SquareMatrix<std::complex<float>_> *)local_1828,
                          (SquareMatrix<std::complex<float>_> *)local_1730);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1888,&local_1889,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1888);
  if (!bVar1) {
    testing::Message::Message(&local_1898);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&prodABCD.data_,(internal *)local_1888,
               (AssertionResult *)"prodABC == prodABC_check","false","true",(char *)in_R9._M_value);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_18a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xc1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_18a0,&local_1898);
    testing::internal::AssertHelper::~AssertHelper(&local_18a0);
    std::__cxx11::string::~string((string *)&prodABCD.data_);
    testing::Message::~Message(&local_1898);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1888);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_58.message_,
             (SquareMatrix<std::complex<float>_> *)local_f60);
  qclab::dense::operator*
            ((dense *)&local_18f0,(SquareMatrix<std::complex<float>_> *)&gtest_ar_58.message_,
             (SquareMatrix<std::complex<float>_> *)local_f90);
  qclab::dense::operator*
            ((dense *)&local_18e0,&local_18f0,(SquareMatrix<std::complex<float>_> *)local_fc0);
  qclab::dense::operator*
            ((dense *)local_18d0,&local_18e0,(SquareMatrix<std::complex<float>_> *)local_ff0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_18e0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_18f0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_58.message_);
  local_1918 = qclab::dense::SquareMatrix<std::complex<float>_>::size
                         ((SquareMatrix<std::complex<float>_> *)local_18d0);
  local_191c = 2;
  cVar5._M_value = (_ComplexT)&local_1918;
  cVar4._M_value = (_ComplexT)&local_191c;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_1910,"prodABCD.size()","2",(long *)cVar5._M_value,
             (int *)cVar4._M_value);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1910);
  if (!bVar1) {
    testing::Message::Message(&local_1928);
    cVar4._M_value =
         (_ComplexT)testing::AssertionResult::failure_message((AssertionResult *)local_1910);
    cVar5._M_value = 0xc4;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xc4,(char *)cVar4._M_value);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__31.message_,&local_1928);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__31.message_);
    testing::Message::~Message(&local_1928);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1910);
  local_1941 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                         ((SquareMatrix<std::complex<float>_> *)local_18d0,
                          (SquareMatrix<std::complex<float>_> *)local_1760);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1940,&local_1941,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1940);
  if (!bVar1) {
    testing::Message::Message(&local_1950);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&prod.data_,(internal *)local_1940,
               (AssertionResult *)"prodABCD == prodABCD_check","false","true",(char *)in_R9._M_value
              );
    cVar4._M_value = std::__cxx11::string::c_str();
    cVar5._M_value = 0xc5;
    testing::internal::AssertHelper::AssertHelper
              (&local_1958,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xc5,(char *)cVar4._M_value);
    testing::internal::AssertHelper::operator=(&local_1958,&local_1950);
    testing::internal::AssertHelper::~AssertHelper(&local_1958);
    std::__cxx11::string::~string((string *)&prod.data_);
    testing::Message::~Message(&local_1950);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1940);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__32.message_,
             (SquareMatrix<std::complex<float>_> *)local_f60);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator*=
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__32.message_,
             (SquareMatrix<std::complex<float>_> *)local_f90);
  local_1999 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                         ((SquareMatrix<std::complex<float>_> *)&gtest_ar__32.message_,
                          (SquareMatrix<std::complex<float>_> *)local_1700);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1998,&local_1999,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1998);
  if (!bVar1) {
    testing::Message::Message(&local_19a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__33.message_,(internal *)local_1998,
               (AssertionResult *)"prod == prodAB_check","false","true",(char *)in_R9._M_value);
    cVar4._M_value = std::__cxx11::string::c_str();
    cVar5._M_value = 200;
    testing::internal::AssertHelper::AssertHelper
              (&local_19b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,200,(char *)cVar4._M_value);
    testing::internal::AssertHelper::operator=(&local_19b0,&local_19a8);
    testing::internal::AssertHelper::~AssertHelper(&local_19b0);
    std::__cxx11::string::~string((string *)&gtest_ar__33.message_);
    testing::Message::~Message(&local_19a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1998);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator*=
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__32.message_,
             (SquareMatrix<std::complex<float>_> *)local_fc0);
  local_19e1 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                         ((SquareMatrix<std::complex<float>_> *)&gtest_ar__32.message_,
                          (SquareMatrix<std::complex<float>_> *)local_1730);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_19e0,&local_19e1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_19e0);
  if (!bVar1) {
    testing::Message::Message(&local_19f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__34.message_,(internal *)local_19e0,
               (AssertionResult *)"prod == prodABC_check","false","true",(char *)in_R9._M_value);
    cVar4._M_value = std::__cxx11::string::c_str();
    cVar5._M_value = 0xc9;
    testing::internal::AssertHelper::AssertHelper
              (&local_19f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xc9,(char *)cVar4._M_value);
    testing::internal::AssertHelper::operator=(&local_19f8,&local_19f0);
    testing::internal::AssertHelper::~AssertHelper(&local_19f8);
    std::__cxx11::string::~string((string *)&gtest_ar__34.message_);
    testing::Message::~Message(&local_19f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_19e0);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator*=
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__32.message_,
             (SquareMatrix<std::complex<float>_> *)local_ff0);
  local_1a29 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                         ((SquareMatrix<std::complex<float>_> *)&gtest_ar__32.message_,
                          (SquareMatrix<std::complex<float>_> *)local_1760);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1a28,&local_1a29,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a28);
  if (!bVar1) {
    testing::Message::Message(&local_1a38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Z.data_,(internal *)local_1a28,(AssertionResult *)"prod == prodABCD_check"
               ,"false","true",(char *)in_R9._M_value);
    cVar4._M_value = std::__cxx11::string::c_str();
    cVar5._M_value = 0xca;
    testing::internal::AssertHelper::AssertHelper
              (&local_1a40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xca,(char *)cVar4._M_value);
    testing::internal::AssertHelper::operator=(&local_1a40,&local_1a38);
    testing::internal::AssertHelper::~AssertHelper(&local_1a40);
    std::__cxx11::string::~string((string *)&Z.data_);
    testing::Message::~Message(&local_1a38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a28);
  cVar6._M_value = 2;
  qclab::dense::zeros<std::complex<float>>((dense *)&Z_check.data_,2);
  std::complex<float>::complex(&local_1a88,0.0,0.0);
  std::complex<float>::complex(&local_1a90,0.0,0.0);
  std::complex<float>::complex(&local_1a98,0.0,0.0);
  std::complex<float>::complex((complex<float> *)&gtest_ar__35.message_,0.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1a80,cVar6,m01_15,cVar5,cVar4);
  local_1ab1 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                         ((SquareMatrix<std::complex<float>_> *)&Z_check.data_,
                          (SquareMatrix<std::complex<float>_> *)local_1a80);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1ab0,&local_1ab1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ab0);
  if (!bVar1) {
    testing::Message::Message(&local_1ac0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&I.data_,(internal *)local_1ab0,(AssertionResult *)"Z == Z_check","false",
               "true",(char *)in_R9._M_value);
    cVar4._M_value = std::__cxx11::string::c_str();
    cVar5._M_value = 0xd0;
    testing::internal::AssertHelper::AssertHelper
              (&local_1ac8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xd0,(char *)cVar4._M_value);
    testing::internal::AssertHelper::operator=(&local_1ac8,&local_1ac0);
    testing::internal::AssertHelper::~AssertHelper(&local_1ac8);
    std::__cxx11::string::~string((string *)&I.data_);
    testing::Message::~Message(&local_1ac0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ab0);
  cVar6._M_value = 2;
  qclab::dense::eye<std::complex<float>>((dense *)&I_check.data_,2);
  std::complex<float>::complex(&local_1b10,1.0,0.0);
  std::complex<float>::complex(&local_1b18,0.0,0.0);
  std::complex<float>::complex(&local_1b20,0.0,0.0);
  std::complex<float>::complex((complex<float> *)&gtest_ar__36.message_,1.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1b08,cVar6,m01_16,cVar5,cVar4);
  local_1b39 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                         ((SquareMatrix<std::complex<float>_> *)&I_check.data_,
                          (SquareMatrix<std::complex<float>_> *)local_1b08);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1b38,&local_1b39,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b38);
  if (!bVar1) {
    testing::Message::Message(&local_1b48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1b70,(internal *)local_1b38,(AssertionResult *)"I == I_check","false","true",
               (char *)in_R9._M_value);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/SquareMatrix.cpp"
               ,0xd6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b50,&local_1b48);
    testing::internal::AssertHelper::~AssertHelper(&local_1b50);
    std::__cxx11::string::~string((string *)&local_1b70);
    testing::Message::~Message(&local_1b48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b38);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1b08);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&I_check.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1a80);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&Z_check.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__32.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_18d0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1828);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1790);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1760);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1730);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1700);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__26.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1560);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_14b8);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1420);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_13f0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_13c0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1390);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__20.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_11f0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1148);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_10b0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1080);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1050);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1020);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_ff0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_fc0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_f90);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_f60);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_db0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_46.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_42.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_38.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_3c8);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_238);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_130);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar.message_);
  return;
}

Assistant:

void test_qclab_dense_SquareMatrix() {

  qclab::dense::SquareMatrix< T >  M1( 3 ) ;
  EXPECT_EQ( M1.size() , 3 ) ;
  EXPECT_EQ( M1.rows() , 3 ) ;
  EXPECT_EQ( M1.cols() , 3 ) ;
  EXPECT_EQ( M1.ld() , 3 ) ;

  int c = 0 ;
  for ( int i = 0; i < 3; i++ ) {
    for ( int j = 0; j < 3; j++ ) {
      M1(i,j) = c + 0.5 ;
      c++ ;
    }
  }
  c = 0 ;
  for ( int i = 0; i < 3; i++ ) {
    for ( int j = 0; j < 3; j++ ) {
      EXPECT_EQ( M1(i,j) , T(c + 0.5) ) ;
      c++ ;
    }
  }

  qclab::dense::SquareMatrix< T >  M2( 3 , 3.14 ) ;
  EXPECT_EQ( M2.size() , 3 ) ;
  EXPECT_EQ( M2.rows() , 3 ) ;
  EXPECT_EQ( M2.cols() , 3 ) ;
  EXPECT_EQ( M2.ld() , 3 ) ;

  for ( int i = 0; i < 3; i++ ) {
    for ( int j = 0; j < 3; j++ ) {
      EXPECT_EQ( M2(i,j) , T(3.14) ) ;
    }
  }

  qclab::dense::SquareMatrix< T >  M3( 1.0 , 2.0 ,
                                       3.0 , 4.0 ) ;
  EXPECT_EQ( M3.size() , 2 ) ;
  EXPECT_EQ( M3.rows() , 2 ) ;
  EXPECT_EQ( M3.cols() , 2 ) ;
  EXPECT_EQ( M3.ld() , 2 ) ;

  EXPECT_EQ( M3(0,0) , T(1.0) ) ;
  EXPECT_EQ( M3(1,0) , T(3.0) ) ;
  EXPECT_EQ( M3(0,1) , T(2.0) ) ;
  EXPECT_EQ( M3(1,1) , T(4.0) ) ;

  qclab::dense::SquareMatrix< T >  M4(  1.0 ,  2.0 ,  3.0 ,  4.0 ,
                                        5.0 ,  6.0 ,  7.0 ,  8.0 ,
                                        9.0 , 10.0 , 11.0 , 12.0 ,
                                       13.0 , 14.0 , 15.0 , 16.0 ) ;
  EXPECT_EQ( M4.size() , 4 ) ;
  EXPECT_EQ( M4.rows() , 4 ) ;
  EXPECT_EQ( M4.cols() , 4 ) ;
  EXPECT_EQ( M4.ld() , 4 ) ;

  // column 1
  EXPECT_EQ( M4(0,0) , T( 1.0) ) ;
  EXPECT_EQ( M4(1,0) , T( 5.0) ) ;
  EXPECT_EQ( M4(2,0) , T( 9.0) ) ;
  EXPECT_EQ( M4(3,0) , T(13.0) ) ;
  // column 2
  EXPECT_EQ( M4(0,1) , T( 2.0) ) ;
  EXPECT_EQ( M4(1,1) , T( 6.0) ) ;
  EXPECT_EQ( M4(2,1) , T(10.0) ) ;
  EXPECT_EQ( M4(3,1) , T(14.0) ) ;
  // column 3
  EXPECT_EQ( M4(0,2) , T( 3.0) ) ;
  EXPECT_EQ( M4(1,2) , T( 7.0) ) ;
  EXPECT_EQ( M4(2,2) , T(11.0) ) ;
  EXPECT_EQ( M4(3,2) , T(15.0) ) ;
  // column 4
  EXPECT_EQ( M4(0,3) , T( 4.0) ) ;
  EXPECT_EQ( M4(1,3) , T( 8.0) ) ;
  EXPECT_EQ( M4(2,3) , T(12.0) ) ;
  EXPECT_EQ( M4(3,3) , T(16.0) ) ;

  qclab::dense::SquareMatrix< T >  M4copy( M4 ) ;
  EXPECT_EQ( M4copy.size() , 4 ) ;
  EXPECT_EQ( M4copy.rows() , 4 ) ;
  EXPECT_EQ( M4copy.cols() , 4 ) ;
  EXPECT_EQ( M4copy.ld() , 4 ) ;
  EXPECT_TRUE( M4copy == M4 ) ;

  // operator =
  qclab::dense::SquareMatrix< T >  M1copy ;
  M1copy = M1 ;
  EXPECT_EQ( M1copy.size() , 3 ) ;
  EXPECT_EQ( M1copy.rows() , 3 ) ;
  EXPECT_EQ( M1copy.cols() , 3 ) ;
  EXPECT_EQ( M1copy.ld() , 3 ) ;
  EXPECT_TRUE( M1copy == M1 ) ;

  qclab::dense::SquareMatrix< T >  M2copy( 3 ) ;
  M2copy = M2 ;
  EXPECT_EQ( M2copy.size() , 3 ) ;
  EXPECT_EQ( M2copy.rows() , 3 ) ;
  EXPECT_EQ( M2copy.cols() , 3 ) ;
  EXPECT_EQ( M2copy.ld() , 3 ) ;
  EXPECT_TRUE( M2copy == M2 ) ;

  // operators == and !=
  EXPECT_TRUE( M2 == M2 ) ; EXPECT_FALSE( M2 != M2 ) ;
  EXPECT_TRUE( M3 == M3 ) ; EXPECT_FALSE( M3 != M3 ) ;
  EXPECT_TRUE( M4 == M4 ) ; EXPECT_FALSE( M4 != M4 ) ;
  EXPECT_TRUE( M2 != M3 ) ; EXPECT_FALSE( M2 == M3 ) ;
  EXPECT_TRUE( M3 != M4 ) ; EXPECT_FALSE( M3 == M4 ) ;

  qclab::dense::SquareMatrix< T >  M5(  1.0 ,  2.0 ,  3.0 ,  4.0 ,
                                        5.0 ,  6.0 ,  0.0 ,  8.0 ,
                                        9.0 , 10.0 , 11.0 , 12.0 ,
                                       13.0 , 14.0 , 15.0 , 16.0 ) ;
  EXPECT_TRUE( M4 != M5 ) ; EXPECT_FALSE( M4 == M5 ) ;
  M5(1,2) = 7.0 ;
  EXPECT_TRUE( M4 == M5 ) ; EXPECT_FALSE( M4 != M5 ) ;

  // operators +=, -=, *=, +, - and *
  qclab::dense::SquareMatrix< T >  A( 1 , 2 ,
                                      3 , 4 ) ;
  qclab::dense::SquareMatrix< T >  B( 5 , 7 ,
                                      6 , 8 ) ;
  qclab::dense::SquareMatrix< T >  C(  9 , 11 ,
                                      10 , 12 ) ;
  qclab::dense::SquareMatrix< T >  D( 13 , 14 ,
                                      15 , 16 ) ;

  qclab::dense::SquareMatrix< T >  sumAB_check(  6 ,  9 ,
                                                 9 , 12 ) ;
  qclab::dense::SquareMatrix< T >  sumABC_check( 15 , 20 ,
                                                 19 , 24 ) ;
  qclab::dense::SquareMatrix< T >  sumABCD_check( 28 , 34 ,
                                                  34 , 40 ) ;

  auto sumAB = A + B ;
  EXPECT_EQ( sumAB.size() , 2 ) ;
  EXPECT_TRUE( sumAB == sumAB_check ) ;

  auto sumABC = A + B + C ;
  EXPECT_EQ( sumABC.size() , 2 ) ;
  EXPECT_TRUE( sumABC == sumABC_check ) ;

  auto sumABCD = A + B + C + D ;
  EXPECT_EQ( sumABCD.size() , 2 ) ;
  EXPECT_TRUE( sumABCD == sumABCD_check ) ;

  auto sum = A ;
  sum += B ;  EXPECT_TRUE( sum == sumAB_check ) ;
  sum += C ;  EXPECT_TRUE( sum == sumABC_check ) ;
  sum += D ;  EXPECT_TRUE( sum == sumABCD_check ) ;

  qclab::dense::SquareMatrix< T >  minusAB_check( -4 , -5 ,
                                                  -3 , -4 ) ;
  qclab::dense::SquareMatrix< T >  minusABC_check( -13 , -16 ,
                                                   -13 , -16 ) ;
  qclab::dense::SquareMatrix< T >  minusABCD_check( -26 , -30 ,
                                                    -28 , -32 ) ;

  auto minusAB = A - B ;
  EXPECT_EQ( minusAB.size() , 2 ) ;
  EXPECT_TRUE( minusAB == minusAB_check ) ;

  auto minusABC = A - B - C ;
  EXPECT_EQ( minusABC.size() , 2 ) ;
  EXPECT_TRUE( minusABC == minusABC_check ) ;

  auto minusABCD = A - B - C - D ;
  EXPECT_EQ( minusABCD.size() , 2 ) ;
  EXPECT_TRUE( minusABCD == minusABCD_check ) ;

  auto minus = A ;
  minus -= B ;  EXPECT_TRUE( minus == minusAB_check ) ;
  minus -= C ;  EXPECT_TRUE( minus == minusABC_check ) ;
  minus -= D ;  EXPECT_TRUE( minus == minusABCD_check ) ;

  qclab::dense::SquareMatrix< T >  prodAB_check( 17 , 23 ,
                                                 39 , 53 ) ;
  qclab::dense::SquareMatrix< T >  prodABC_check( 383 ,  463 ,
                                                  881 , 1065 ) ;
  qclab::dense::SquareMatrix< T >  prodABCD_check( 11924 , 12770 ,
                                                   27428 , 29374 ) ;

  auto prodAB = A * B ;
  EXPECT_EQ( prodAB.size() , 2 ) ;
  EXPECT_TRUE( prodAB == prodAB_check ) ;

  auto prodABC = A * B * C ;
  EXPECT_EQ( prodABC.size() , 2 ) ;
  EXPECT_TRUE( prodABC == prodABC_check ) ;

  auto prodABCD = A * B * C * D ;
  EXPECT_EQ( prodABCD.size() , 2 ) ;
  EXPECT_TRUE( prodABCD == prodABCD_check ) ;

  auto prod = A ;
  prod *= B ;  EXPECT_TRUE( prod == prodAB_check ) ;
  prod *= C ;  EXPECT_TRUE( prod == prodABC_check ) ;
  prod *= D ;  EXPECT_TRUE( prod == prodABCD_check ) ;

  // zeros
  auto Z = qclab::dense::zeros< T >( 2 ) ;
  qclab::dense::SquareMatrix< T >  Z_check( 0 , 0 ,
                                            0 , 0 ) ;
  EXPECT_TRUE( Z == Z_check ) ;

  // eye
  auto I = qclab::dense::eye< T >( 2 ) ;
  qclab::dense::SquareMatrix< T >  I_check( 1 , 0 ,
                                            0 , 1 ) ;
  EXPECT_TRUE( I == I_check ) ;

}